

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-bind-error.c
# Opt level: O2

int run_test_pipe_bind_error_addrinuse(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  char *pcVar3;
  char *pcVar4;
  undefined8 uVar5;
  int64_t eval_b;
  int64_t eval_b_2;
  uv_pipe_t server2;
  uv_pipe_t server1;
  
  puVar2 = uv_default_loop();
  iVar1 = uv_pipe_init(puVar2,&server1,0);
  server2.data = (void *)(long)iVar1;
  if (server2.data == (void *)0x0) {
    iVar1 = uv_pipe_bind(&server1,"/tmp/uv-test-sock");
    server2.data = (void *)(long)iVar1;
    if (server2.data == (void *)0x0) {
      puVar2 = uv_default_loop();
      iVar1 = uv_pipe_init(puVar2,&server2,0);
      eval_b = (int64_t)iVar1;
      eval_b_2 = 0;
      if ((void *)eval_b == (void *)0x0) {
        iVar1 = uv_pipe_bind(&server2,"/tmp/uv-test-sock");
        eval_b = (int64_t)iVar1;
        eval_b_2 = -0x62;
        if ((void *)eval_b == (void *)0xffffffffffffff9e) {
          iVar1 = uv_listen((uv_stream_t *)&server1,0x1000,(uv_connection_cb)0x0);
          eval_b = (int64_t)iVar1;
          eval_b_2 = 0;
          if ((void *)eval_b == (void *)0x0) {
            iVar1 = uv_listen((uv_stream_t *)&server2,0x1000,(uv_connection_cb)0x0);
            eval_b = (int64_t)iVar1;
            eval_b_2 = -0x16;
            if ((void *)eval_b == (void *)0xffffffffffffffea) {
              uv_close((uv_handle_t *)&server1,close_cb);
              uv_close((uv_handle_t *)&server2,close_cb);
              puVar2 = uv_default_loop();
              uv_run(puVar2,UV_RUN_DEFAULT);
              eval_b = 2;
              eval_b_2 = (int64_t)close_cb_called;
              if (eval_b_2 == 2) {
                puVar2 = uv_default_loop();
                close_loop(puVar2);
                eval_b = 0;
                puVar2 = uv_default_loop();
                iVar1 = uv_loop_close(puVar2);
                eval_b_2 = (int64_t)iVar1;
                if (eval_b_2 == 0) {
                  uv_library_shutdown();
                  return 0;
                }
                pcVar4 = "uv_loop_close(uv_default_loop())";
                pcVar3 = "0";
                uVar5 = 0x48;
              }
              else {
                pcVar4 = "close_cb_called";
                pcVar3 = "2";
                uVar5 = 0x46;
              }
            }
            else {
              pcVar4 = "UV_EINVAL";
              pcVar3 = "r";
              uVar5 = 0x3f;
            }
          }
          else {
            pcVar4 = "0";
            pcVar3 = "r";
            uVar5 = 0x3d;
          }
        }
        else {
          pcVar4 = "UV_EADDRINUSE";
          pcVar3 = "r";
          uVar5 = 0x3a;
        }
      }
      else {
        pcVar4 = "0";
        pcVar3 = "r";
        uVar5 = 0x38;
      }
      goto LAB_0015b432;
    }
    uVar5 = 0x35;
  }
  else {
    uVar5 = 0x33;
  }
  pcVar4 = "0";
  pcVar3 = "r";
  eval_b_2 = 0;
  eval_b = (int64_t)server2.data;
LAB_0015b432:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-bind-error.c"
          ,uVar5,pcVar3,"==",pcVar4,eval_b,"==",eval_b_2);
  abort();
}

Assistant:

TEST_IMPL(pipe_bind_error_addrinuse) {
  uv_pipe_t server1, server2;
  int r;

  r = uv_pipe_init(uv_default_loop(), &server1, 0);
  ASSERT_OK(r);
  r = uv_pipe_bind(&server1, TEST_PIPENAME);
  ASSERT_OK(r);

  r = uv_pipe_init(uv_default_loop(), &server2, 0);
  ASSERT_OK(r);
  r = uv_pipe_bind(&server2, TEST_PIPENAME);
  ASSERT_EQ(r, UV_EADDRINUSE);

  r = uv_listen((uv_stream_t*)&server1, SOMAXCONN, NULL);
  ASSERT_OK(r);
  r = uv_listen((uv_stream_t*)&server2, SOMAXCONN, NULL);
  ASSERT_EQ(r, UV_EINVAL);

  uv_close((uv_handle_t*)&server1, close_cb);
  uv_close((uv_handle_t*)&server2, close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(2, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}